

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O0

void __thiscall CLayerQuads::CLayerQuads(CLayerQuads *this)

{
  char *in_RDI;
  char *dst;
  CLayer *in_stack_ffffffffffffffe0;
  
  CLayer::CLayer(in_stack_ffffffffffffffe0);
  *(undefined ***)in_RDI = &PTR__CLayerQuads_00299e98;
  dst = in_RDI + 0x30;
  array<CQuad,_allocator_default<CQuad>_>::array
            ((array<CQuad,_allocator_default<CQuad>_> *)0x20ceb7);
  in_RDI[0x1c] = '\x03';
  in_RDI[0x1d] = '\0';
  in_RDI[0x1e] = '\0';
  in_RDI[0x1f] = '\0';
  str_copy(dst,in_RDI,0);
  in_RDI[0x28] = -1;
  in_RDI[0x29] = -1;
  in_RDI[0x2a] = -1;
  in_RDI[0x2b] = -1;
  return;
}

Assistant:

CLayerQuads::CLayerQuads()
{
	m_Type = LAYERTYPE_QUADS;
	str_copy(m_aName, "Quads", sizeof(m_aName));
	m_Image = -1;
}